

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAdsPerformance::Read(TestAdsPerformance *this,size_t numLoops)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  byte bVar5;
  size_t sVar6;
  uint32_t buffer;
  uint32_t bytesRead;
  string local_50;
  
  lVar2 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_50,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 != 0,&local_50,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3a5);
  std::__cxx11::string::~string((string *)&local_50);
  sVar6 = 0;
  do {
    for (; sVar6 != numLoops; sVar6 = sVar6 + 1) {
      (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
      lVar3 = AdsSyncReadReqEx2(lVar2,(AmsAddr *)&server,0x4020,0,4,&buffer,&bytesRead);
      bVar5 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
      if ((lVar3 != 0) != (bool)bVar5) {
        poVar4 = std::operator<<((ostream *)&std::cout,"i");
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\n");
        bVar1 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
        fructose::test_root::get_test_name_abi_cxx11_(&local_50,(test_root *)this);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar1,&local_50,
                   "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3ad);
        std::__cxx11::string::~string((string *)&local_50);
        bVar5 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
      }
      (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
      if ((bytesRead != 4) != (bool)(bVar5 & 1)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"i");
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\n");
        bVar1 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
        fructose::test_root::get_test_name_abi_cxx11_(&local_50,(test_root *)this);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar1,&local_50,"sizeof(buffer) == bytesRead",
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3ae);
        std::__cxx11::string::~string((string *)&local_50);
        bVar5 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
      }
      (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
      if ((buffer != 0) != (bool)(bVar5 & 1)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"i");
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\n");
        bVar1 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
        fructose::test_root::get_test_name_abi_cxx11_(&local_50,(test_root *)this);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar1,&local_50,"0 == buffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3af);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    sVar6 = 0;
  } while (this->runEndurance != false);
  lVar2 = AdsPortCloseEx(lVar2);
  fructose::test_root::get_test_name_abi_cxx11_(&local_50,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_50,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3b2);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Read(const size_t numLoops)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t bytesRead;
        uint32_t buffer;
        do {
            for (size_t i = 0; i < numLoops; ++i) {
                fructose_loop_assert(i,
                                     0 ==
                                     AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
                fructose_loop_assert(i, sizeof(buffer) == bytesRead);
                fructose_loop_assert(i, 0 == buffer);
            }
        } while (runEndurance);
        fructose_assert(0 == AdsPortCloseEx(port));
    }